

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::CumulativeReporterBase::sectionEnded(CumulativeReporterBase *this,SectionStats *sectionStats)

{
  pointer *pppSVar1;
  
  SectionStats::operator=
            (&(this->m_sectionStack).
              super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]->stats,sectionStats);
  pppSVar1 = &(this->m_sectionStack).
              super__Vector_base<Catch::CumulativeReporterBase::SectionNode_*,_std::allocator<Catch::CumulativeReporterBase::SectionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *pppSVar1 = *pppSVar1 + -1;
  return;
}

Assistant:

void CumulativeReporterBase::sectionEnded( SectionStats const& sectionStats ) {
        assert( !m_sectionStack.empty() );
        SectionNode& node = *m_sectionStack.back();
        node.stats = sectionStats;
        m_sectionStack.pop_back();
    }